

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall sznet::Logger::Impl::formatTime(Impl *this)

{
  int iVar1;
  int64_t iVar2;
  long n;
  long *in_FS_OFFSET;
  undefined1 local_78 [8];
  Fmt us;
  T local_40;
  T local_30;
  
  iVar2 = Timestamp::microSecondsSinceEpoch(&this->m_time);
  n = iVar2 / 1000000;
  if (n != in_FS_OFFSET[-0x48]) {
    in_FS_OFFSET[-0x48] = n;
    sz_localtime((tm *)local_78,n);
    iVar1 = snprintf((char *)(*in_FS_OFFSET + -0x280),0x40,"%4d%02d%02d %02d:%02d:%02d",
                     (ulong)(us.m_buf._12_4_ + 0x76c),(ulong)(us.m_buf._8_4_ + 1),
                     (ulong)(uint)us.m_buf._4_4_,(ulong)(uint)us.m_buf._0_4_,
                     (ulong)(uint)local_78._4_4_,(ulong)(uint)local_78._0_4_);
    if (iVar1 != 0x11) {
      __assert_fail("len == 17",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/log/Logging.cpp"
                    ,0x89,"void sznet::Logger::Impl::formatTime()");
    }
  }
  Fmt::Fmt<int>((Fmt *)local_78,".%06d ",(int)(iVar2 % 1000000));
  if (us.m_buf._24_4_ == 8) {
    T::T(&local_40,(char *)(*in_FS_OFFSET + -0x280),0x11);
    LogStream::append(&this->m_stream,local_40.m_str,local_40.m_len);
    T::T(&local_30,local_78,8);
    LogStream::append(&this->m_stream,local_30.m_str,local_30.m_len);
    return;
  }
  __assert_fail("us.length() == 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/log/Logging.cpp"
                ,0x8d,"void sznet::Logger::Impl::formatTime()");
}

Assistant:

void Logger::Impl::formatTime()
{
	int64_t microSecondsSinceEpoch = m_time.microSecondsSinceEpoch();
	time_t seconds = static_cast<time_t>(microSecondsSinceEpoch / Timestamp::kMicroSecondsPerSecond);
	int microSeconds = static_cast<int>(microSecondsSinceEpoch % Timestamp::kMicroSecondsPerSecond);
	if (seconds != t_lastSecond)
	{
		t_lastSecond = seconds;
		struct tm tm_time;
		sz_localtime(tm_time, seconds);
		int len = snprintf(t_time, sizeof(t_time), "%4d%02d%02d %02d:%02d:%02d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
		assert(len == 17);
		(void)len;
	}
	Fmt us(".%06d ", microSeconds);
	assert(us.length() == 8);
	m_stream << T(t_time, 17) << T(us.data(), 8);
}